

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::EnumLiteGenerator::Generate
          (EnumLiteGenerator *this,Printer *printer)

{
  char cVar1;
  Context *pCVar2;
  pointer pcVar3;
  ushort *puVar4;
  Printer *pPVar5;
  long *plVar6;
  string *psVar7;
  EnumValueDescriptor *pEVar8;
  pointer ppEVar9;
  EnumLiteGenerator *pEVar10;
  bool bVar11;
  byte bVar12;
  Nonnull<char_*> pcVar13;
  EnumDescriptor *pEVar14;
  Nonnull<const_char_*> pcVar15;
  Options *options;
  anon_union_8_1_a8a14541_for_iterator_2 options_00;
  char *pcVar16;
  Printer *pPVar17;
  long lVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  long lVar20;
  size_t sVar21;
  long lVar22;
  _Alloc_hider _Var23;
  pointer ppEVar24;
  string_view text;
  string_view begin_varname;
  string_view text_00;
  string_view begin_varname_00;
  string_view text_01;
  string_view begin_varname_01;
  string_view text_02;
  string_view begin_varname_02;
  string_view begin_varname_03;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars_1;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  EnumLiteGenerator *local_1c8;
  Printer *local_1c0;
  anon_union_8_1_a8a14541_for_iterator_2 local_1b8;
  pointer local_1b0;
  undefined1 local_1a8 [40];
  string local_180 [16];
  EnumValueOptions *local_170 [2];
  long *local_160 [2];
  long local_150 [2];
  undefined2 local_140;
  undefined1 local_138 [8];
  long *local_130;
  long local_120 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  long local_100 [2];
  undefined2 local_f0;
  undefined1 local_e8 [8];
  long *local_e0;
  long local_d0 [2];
  long *local_c0 [2];
  long local_b0 [2];
  undefined2 local_a0;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_98;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  pEVar14 = this->descriptor_;
  pCVar2 = this->context_;
  local_80[4] = (pCVar2->options_).opensource_runtime;
  local_80[5] = (pCVar2->options_).annotate_code;
  local_80[0] = (pCVar2->options_).generate_immutable_code;
  local_80[1] = (pCVar2->options_).generate_mutable_code;
  local_80[2] = (pCVar2->options_).generate_shared_code;
  local_80[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_1c8 = this;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_80 + 8),pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_38._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_38._1_1_ = (pCVar2->options_).jvm_dsl;
  local_1c0 = printer;
  WriteEnumDocComment(printer,pEVar14,(Options *)local_80,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  pEVar10 = local_1c8;
  pCVar2 = local_1c8->context_;
  pEVar14 = local_1c8->descriptor_;
  bVar11 = local_1c8->immutable_api_;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
  pPVar17 = local_1c0;
  MaybePrintGeneratedAnnotation<google::protobuf::EnumDescriptor_const>
            (pCVar2,local_1c0,pEVar14,bVar11,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  puVar4 = (ushort *)(pEVar10->descriptor_->all_names_).payload_;
  local_218._M_dataplus._M_p = (pointer)(ulong)*puVar4;
  local_218._M_string_length = (long)puVar4 + ~(ulong)local_218._M_dataplus._M_p;
  local_1e8._M_dataplus._M_p = "";
  if ((pEVar10->descriptor_->options_->field_0)._impl_.deprecated_ != false) {
    local_1e8._M_dataplus._M_p = "@java.lang.Deprecated ";
  }
  text._M_str = 
  "$deprecation$public enum $classname$\n    implements com.google.protobuf.Internal.EnumLite {\n";
  text._M_len = 0x5c;
  io::Printer::
  Print<char[10],std::basic_string_view<char,std::char_traits<char>>,char[12],char_const*>
            (pPVar17,text,(char (*) [10])0x549f88,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_218,(char (*) [12])0x633a99,
             (char **)&local_1e8);
  begin_varname._M_str = "classname";
  begin_varname._M_len = 9;
  end_varname._M_str = "classname";
  end_varname._M_len = 9;
  options = (Options *)0x9;
  io::Printer::Annotate<google::protobuf::EnumDescriptor>
            (pPVar17,begin_varname,end_varname,pEVar10->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pPVar17->indent_ = pPVar17->indent_ + (pPVar17->options_).spaces_per_indent;
  _Var23._M_p = (pointer)(pEVar10->canonical_values_).
                         super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._16_8_ =
       (pEVar10->canonical_values_).
       super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var23._M_p != (pointer)local_1a8._16_8_) {
    local_1a8._24_8_ = (long)absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
    do {
      pPVar5 = *(Printer **)_Var23._M_p;
      local_1e8._M_dataplus._M_p = (pointer)0x0;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_allocated_capacity = local_1a8._24_8_;
      plVar6 = (long *)(pPVar5->sink_).buffer_;
      lVar18 = *plVar6;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,lVar18,plVar6[1] + lVar18);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[5]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1b8,&local_1e8,(char (*) [5])0x6fff3e);
      std::__cxx11::string::operator=((string *)(local_1b0 + 0x10),(string *)&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,
                        (ulong)(local_218.field_2._M_allocated_capacity + 1));
      }
      paVar19 = &local_218.field_2;
      pcVar13 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                          (*(int32_t *)((long)&(pPVar5->sink_).stream_ + 4),paVar19->_M_local_buf);
      local_218._M_dataplus._M_p = pcVar13 + -(long)paVar19;
      options_00.slot_ = (slot_type *)local_1a8;
      local_218._M_string_length = (size_type)paVar19;
      local_1b8.slot_ = options_00.slot_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,paVar19,pcVar13);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[7]>(&local_98,&local_1e8,(char (*) [7])0x6ca8c3);
      std::__cxx11::string::operator=
                ((string *)((long)local_98.first.field_1.slot_ + 0x10),(string *)&local_1b8);
      if (local_1b8.slot_ != (slot_type *)local_1a8) {
        operator_delete(local_1b8.slot_,local_1a8._0_8_ + 1);
      }
      pCVar2 = local_1c8->context_;
      local_e8[4] = (pCVar2->options_).opensource_runtime;
      local_e8[5] = (pCVar2->options_).annotate_code;
      local_e8[0] = (pCVar2->options_).generate_immutable_code;
      local_e8[1] = (pCVar2->options_).generate_mutable_code;
      local_e8[2] = (pCVar2->options_).generate_shared_code;
      local_e8[3] = (pCVar2->options_).enforce_lite;
      local_e0 = local_d0;
      pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,pcVar3,
                 pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
      local_c0[0] = local_b0;
      pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_d0 + 2),pcVar3,
                 pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
      local_a0._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
      local_a0._1_1_ = (pCVar2->options_).jvm_dsl;
      WriteEnumValueDocComment
                ((java *)pPVar17,pPVar5,(EnumValueDescriptor *)(local_100 + 3),
                 (Options *)options_00.slot_);
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0],local_b0[0] + 1);
      }
      if (local_e0 != local_d0) {
        operator_delete(local_e0,local_d0[0] + 1);
      }
      if (*(char *)((pPVar5->sink_).bytes_written_ + 0x58) == '\x01') {
        text_00._M_str = "@java.lang.Deprecated\n";
        text_00._M_len = 0x16;
        io::Printer::Print<>(pPVar17,text_00);
      }
      text_19._M_str = "$name$($number$),\n";
      text_19._M_len = 0x12;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar17,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_1e8,text_19);
      begin_varname_00._M_str = "name";
      begin_varname_00._M_len = 4;
      end_varname_00._M_str = "name";
      end_varname_00._M_len = 4;
      options = (Options *)0x4;
      io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
                (pPVar17,begin_varname_00,end_varname_00,(EnumValueDescriptor *)pPVar5,
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_1e8);
      _Var23._M_p = _Var23._M_p + 8;
    } while (_Var23._M_p != (pointer)local_1a8._16_8_);
  }
  pEVar10 = local_1c8;
  bVar11 = EnumDescriptor::is_closed(local_1c8->descriptor_);
  if (!bVar11) {
    text_01._M_str = "${$UNRECOGNIZED$}$(-1),\n";
    text_01._M_len = 0x18;
    io::Printer::Print<char[2],char[1],char[2],char[1]>
              (pPVar17,text_01,(char (*) [2])0x55d19e,(char (*) [1])0x4f289c,(char (*) [2])0x6344cd,
               (char (*) [1])0x4f289c);
    begin_varname_01._M_str = "{";
    begin_varname_01._M_len = 1;
    end_varname_01._M_str = "}";
    end_varname_01._M_len = 1;
    options = (Options *)0x1;
    io::Printer::Annotate<google::protobuf::EnumDescriptor>
              (pPVar17,begin_varname_01,end_varname_01,pEVar10->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  }
  text_02._M_str = ";\n\n";
  text_02._M_len = 3;
  io::Printer::Print<>(pPVar17,text_02);
  _Var23._M_p = (pointer)(pEVar10->aliases_).
                         super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
                         ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._16_8_ =
       (pEVar10->aliases_).
       super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var23._M_p != (pointer)local_1a8._16_8_) {
    paVar19 = &local_1e8.field_2;
    local_1a8._24_8_ = (long)absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
    do {
      local_218._M_dataplus._M_p = (Nonnull<char_*>)0x0;
      local_218._M_string_length = 0;
      local_218.field_2._M_allocated_capacity = local_1a8._24_8_;
      puVar4 = (ushort *)(local_1c8->descriptor_->all_names_).payload_;
      local_1e8._M_dataplus._M_p = (pointer)paVar19;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,(long)puVar4 + ~(ulong)*puVar4,(long)puVar4 + -1);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[10]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1b8,&local_218,(char (*) [10])0x549f88);
      std::__cxx11::string::operator=((string *)(local_1b0 + 0x10),(string *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar19) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        (ulong)(local_1e8.field_2._M_allocated_capacity + 1));
      }
      psVar7 = ((pointer)_Var23._M_p)->value->all_names_;
      pcVar3 = (psVar7->_M_dataplus)._M_p;
      local_1e8._M_dataplus._M_p = (pointer)paVar19;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,pcVar3,pcVar3 + psVar7->_M_string_length);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[5]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1b8,&local_218,(char (*) [5])0x6fff3e);
      std::__cxx11::string::operator=((string *)(local_1b0 + 0x10),(string *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar19) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        (ulong)(local_1e8.field_2._M_allocated_capacity + 1));
      }
      psVar7 = ((pointer)_Var23._M_p)->canonical_value->all_names_;
      pcVar3 = (psVar7->_M_dataplus)._M_p;
      local_1e8._M_dataplus._M_p = (pointer)paVar19;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,pcVar3,pcVar3 + psVar7->_M_string_length);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[15]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1b8,&local_218,(char (*) [15])"canonical_name");
      std::__cxx11::string::operator=((string *)(local_1b0 + 0x10),(string *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar19) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        (ulong)(local_1e8.field_2._M_allocated_capacity + 1));
      }
      pPVar17 = (Printer *)((pointer)_Var23._M_p)->value;
      pCVar2 = local_1c8->context_;
      local_138[4] = (pCVar2->options_).opensource_runtime;
      local_138[5] = (pCVar2->options_).annotate_code;
      local_138[0] = (pCVar2->options_).generate_immutable_code;
      local_138[1] = (pCVar2->options_).generate_mutable_code;
      local_138[2] = (pCVar2->options_).generate_shared_code;
      local_138[3] = (pCVar2->options_).enforce_lite;
      local_130 = local_120;
      pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar3,
                 pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
      local_110._M_allocated_capacity = (size_type)local_100;
      pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar3,
                 pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
      pPVar5 = local_1c0;
      local_f0._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
      local_f0._1_1_ = (pCVar2->options_).jvm_dsl;
      WriteEnumValueDocComment
                ((java *)local_1c0,pPVar17,(EnumValueDescriptor *)(local_150 + 3),options);
      if ((long *)local_110._M_allocated_capacity != local_100) {
        operator_delete((void *)local_110._M_allocated_capacity,local_100[0] + 1);
      }
      if (local_130 != local_120) {
        operator_delete(local_130,local_120[0] + 1);
      }
      text_20._M_str = "public static final $classname$ $name$ = $canonical_name$;\n";
      text_20._M_len = 0x3b;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar5,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_218,text_20);
      begin_varname_02._M_str = "name";
      begin_varname_02._M_len = 4;
      end_varname_02._M_str = "name";
      end_varname_02._M_len = 4;
      options = (Options *)0x4;
      io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
                (local_1c0,begin_varname_02,end_varname_02,((pointer)_Var23._M_p)->value,
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_218);
      _Var23._M_p = _Var23._M_p + 0x10;
      pPVar17 = local_1c0;
    } while (_Var23._M_p != (pointer)local_1a8._16_8_);
  }
  pEVar10 = local_1c8;
  pEVar14 = local_1c8->descriptor_;
  if (0 < pEVar14->value_count_) {
    lVar22 = 0;
    local_1a8._16_8_ = (long)absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
    lVar18 = 0;
    do {
      local_1e8._M_dataplus._M_p = (pointer)0x0;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_allocated_capacity = local_1a8._16_8_;
      if (pEVar14->value_count_ <= lVar18) {
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar18,(long)pEVar14->value_count_,"index < value_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,pcVar15);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_1b8);
      }
      plVar6 = *(long **)((long)&pEVar14->values_->all_names_ + lVar22);
      lVar20 = *plVar6;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,lVar20,plVar6[1] + lVar20);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[5]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1b8,&local_1e8,(char (*) [5])0x6fff3e);
      std::__cxx11::string::operator=((string *)(local_1b0 + 0x10),(string *)&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,
                        (ulong)(local_218.field_2._M_allocated_capacity + 1));
      }
      paVar19 = &local_218.field_2;
      lVar20 = (long)pEVar10->descriptor_->value_count_;
      if (lVar20 <= lVar18) {
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar18,lVar20,"index < value_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_98,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,pcVar15);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_98);
      }
      pcVar13 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                          (*(int32_t *)((long)&pEVar10->descriptor_->values_->number_ + lVar22),
                           paVar19->_M_local_buf);
      local_218._M_dataplus._M_p = pcVar13 + -(long)paVar19;
      local_218._M_string_length = (size_type)paVar19;
      local_1b8.slot_ = (slot_type *)local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,paVar19,pcVar13);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[7]>(&local_98,&local_1e8,(char (*) [7])0x6ca8c3);
      std::__cxx11::string::operator=
                ((string *)((long)local_98.first.field_1.slot_ + 0x10),(string *)&local_1b8);
      if (local_1b8.slot_ != (slot_type *)local_1a8) {
        operator_delete(local_1b8.slot_,local_1a8._0_8_ + 1);
      }
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[2]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_218,&local_1e8,(char (*) [2])0x55d19e);
      std::__cxx11::string::_M_replace
                (local_218._M_string_length + 0x10,0,*(char **)(local_218._M_string_length + 0x18),
                 0x4f289c);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[2]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_218,&local_1e8,(char (*) [2])0x6344cd);
      std::__cxx11::string::_M_replace
                (local_218._M_string_length + 0x10,0,*(char **)(local_218._M_string_length + 0x18),
                 0x4f289c);
      lVar20 = (long)pEVar10->descriptor_->value_count_;
      if (lVar20 <= lVar18) {
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar18,lVar20,"index < value_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,pcVar15);
LAB_0033cc8d:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_218);
      }
      cVar1 = *(char *)(*(long *)((long)&pEVar10->descriptor_->values_->options_ + lVar22) + 0x58);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[12]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_218,&local_1e8,(char (*) [12])0x633a99);
      pcVar16 = "";
      if (cVar1 != '\0') {
        pcVar16 = "@java.lang.Deprecated ";
      }
      std::__cxx11::string::_M_replace
                (local_218._M_string_length + 0x10,0,*(char **)(local_218._M_string_length + 0x18),
                 (ulong)pcVar16);
      lVar20 = (long)pEVar10->descriptor_->value_count_;
      if (lVar20 <= lVar18) {
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar18,lVar20,"index < value_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,pcVar15);
        goto LAB_0033cc8d;
      }
      pEVar8 = pEVar10->descriptor_->values_;
      pCVar2 = pEVar10->context_;
      local_1a8[0x24] = (pCVar2->options_).opensource_runtime;
      local_1a8[0x25] = (pCVar2->options_).annotate_code;
      local_1a8[0x20] = (pCVar2->options_).generate_immutable_code;
      local_1a8[0x21] = (pCVar2->options_).generate_mutable_code;
      local_1a8[0x22] = (pCVar2->options_).generate_shared_code;
      local_1a8[0x23] = (pCVar2->options_).enforce_lite;
      local_180._0_8_ = local_170;
      pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                (local_180,pcVar3,pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length)
      ;
      local_160[0] = local_150;
      pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_160,pcVar3,
                 pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
      pPVar17 = local_1c0;
      local_140._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
      local_140._1_1_ = (pCVar2->options_).jvm_dsl;
      WriteEnumValueDocComment
                ((java *)local_1c0,(Printer *)(&pEVar8->super_SymbolBaseN<0> + lVar22),
                 (EnumValueDescriptor *)(local_1a8 + 0x20),(Options *)pcVar16);
      if (local_160[0] != local_150) {
        operator_delete(local_160[0],local_150[0] + 1);
      }
      if ((EnumValueOptions **)local_180._0_8_ != local_170) {
        operator_delete((void *)local_180._0_8_,
                        (ulong)((long)&(local_170[0]->super_Message).super_MessageLite.
                                       _vptr_MessageLite + 1));
      }
      text_21._M_str = "$deprecation$public static final int ${$$name$_VALUE$}$ = $number$;\n";
      text_21._M_len = 0x44;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar17,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_1e8,text_21);
      lVar20 = (long)pEVar10->descriptor_->value_count_;
      if (lVar20 <= lVar18) {
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar18,lVar20,"index < value_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_218,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,pcVar15);
        goto LAB_0033cc8d;
      }
      begin_varname_03._M_str = "{";
      begin_varname_03._M_len = 1;
      end_varname_03._M_str = "}";
      end_varname_03._M_len = 1;
      io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
                (local_1c0,begin_varname_03,end_varname_03,
                 (EnumValueDescriptor *)
                 (&pEVar10->descriptor_->values_->super_SymbolBaseN<0> + lVar22),
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_1e8);
      lVar18 = lVar18 + 1;
      pEVar14 = pEVar10->descriptor_;
      lVar22 = lVar22 + 0x30;
      pPVar17 = local_1c0;
    } while (lVar18 < pEVar14->value_count_);
  }
  text_03._M_str = "\n";
  text_03._M_len = 1;
  io::Printer::Print<>(pPVar17,text_03);
  text_04._M_str = "\n@java.lang.Override\npublic final int getNumber() {\n";
  text_04._M_len = 0x34;
  io::Printer::Print<>(pPVar17,text_04);
  bVar11 = EnumDescriptor::is_closed(pEVar10->descriptor_);
  if (!bVar11) {
    text_05._M_str =
         "  if (this == UNRECOGNIZED) {\n    throw new java.lang.IllegalArgumentException(\n        \"Can\'t get the number of an unknown enum value.\");\n  }\n"
    ;
    text_05._M_len = 0x8f;
    io::Printer::Print<>(pPVar17,text_05);
  }
  text_06._M_str = "  return value;\n}\n\n";
  text_06._M_len = 0x13;
  io::Printer::Print<>(pPVar17,text_06);
  bVar12 = (pEVar10->context_->options_).opensource_runtime;
  if ((bool)bVar12 == true) {
    puVar4 = (ushort *)(pEVar10->descriptor_->all_names_).payload_;
    local_218._M_dataplus._M_p = (pointer)(ulong)*puVar4;
    local_218._M_string_length = (long)puVar4 + ~(ulong)local_218._M_dataplus._M_p;
    text_07._M_str =
         "/**\n * @param value The number of the enum to look for.\n * @return The enum associated with the given number.\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $classname$ valueOf(int value) {\n  return forNumber(value);\n}\n\n"
    ;
    text_07._M_len = 0x109;
    io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
              (pPVar17,text_07,(char (*) [10])0x549f88,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_218);
    bVar12 = (pEVar10->context_->options_).opensource_runtime;
  }
  if ((bVar12 & 1) == 0) {
    text_08._M_str = "@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n";
    text_08._M_len = 0x37;
    io::Printer::Print<>(pPVar17,text_08);
  }
  puVar4 = (ushort *)(pEVar10->descriptor_->all_names_).payload_;
  local_218._M_dataplus._M_p = (pointer)(ulong)*puVar4;
  local_218._M_string_length = (long)puVar4 + ~(ulong)local_218._M_dataplus._M_p;
  text_09._M_str = "public static $classname$ forNumber(int value) {\n  switch (value) {\n";
  text_09._M_len = 0x44;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (pPVar17,text_09,(char (*) [10])0x549f88,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_218);
  pPVar17->indent_ = pPVar17->indent_ + (pPVar17->options_).spaces_per_indent * 2;
  ppEVar24 = (pEVar10->canonical_values_).
             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppEVar9 = (pEVar10->canonical_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar24 != ppEVar9) {
    do {
      psVar7 = (*ppEVar24)->all_names_;
      local_1b0 = (psVar7->_M_dataplus)._M_p;
      local_1b8 = (anon_union_8_1_a8a14541_for_iterator_2)psVar7->_M_string_length;
      paVar19 = &local_218.field_2;
      pcVar13 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                          ((*ppEVar24)->number_,paVar19->_M_local_buf);
      local_218._M_dataplus._M_p = pcVar13 + -(long)paVar19;
      local_218._M_string_length = (size_type)paVar19;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,paVar19,pcVar13);
      text_10._M_str = "case $number$: return $name$;\n";
      text_10._M_len = 0x1e;
      io::Printer::
      Print<char[5],std::basic_string_view<char,std::char_traits<char>>,char[7],std::__cxx11::string>
                (pPVar17,text_10,(char (*) [5])0x6fff3e,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_1b8,
                 (char (*) [7])0x6ca8c3,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        (ulong)(local_1e8.field_2._M_allocated_capacity + 1));
      }
      ppEVar24 = ppEVar24 + 1;
    } while (ppEVar24 != ppEVar9);
  }
  io::Printer::Outdent(pPVar17);
  io::Printer::Outdent(pPVar17);
  pEVar10 = local_1c8;
  puVar4 = (ushort *)(local_1c8->descriptor_->all_names_).payload_;
  local_218._M_dataplus._M_p = (pointer)(ulong)*puVar4;
  local_218._M_string_length = (long)puVar4 + ~(ulong)local_218._M_dataplus._M_p;
  text_11._M_str =
       "    default: return null;\n  }\n}\n\npublic static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n    internalGetValueMap() {\n  return internalValueMap;\n}\nprivate static final com.google.protobuf.Internal.EnumLiteMap<\n    $classname$> internalValueMap =\n      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n        @java.lang.Override\n        public $classname$ findValueByNumber(int number) {\n          return $classname$.forNumber(number);\n        }\n      };\n\npublic static com.google.protobuf.Internal.EnumVerifier \n    internalGetVerifier() {\n  return $classname$Verifier.INSTANCE;\n}\n\nprivate static final class $classname$Verifier implements \n     com.google.protobuf.Internal.EnumVerifier { \n        static final com.google.protobuf.Internal.EnumVerifier\n            INSTANCE = new $classname$Verifier();\n        @java.lang.Override\n        public boolean isInRange(int number) {\n          return $classname$.forNumber(number) != null;\n        }\n      };\n\n"
  ;
  text_11._M_len = 0x3d4;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (pPVar17,text_11,(char (*) [10])0x549f88,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_218);
  if ((pEVar10->context_->options_).opensource_runtime == false) {
    text_12._M_str =
         "/**\n * Override of toString that prints the number and name.\n * This is primarily intended as a developer aid.\n *\n * <p>NOTE: This implementation is liable to change in the future,\n * and should not be relied on in code.\n */\n@java.lang.Override\npublic java.lang.String toString() {\n  StringBuilder result = new StringBuilder(\"<\");\n  result.append(getClass().getName()).append(\'@\')\n      .append(java.lang.Integer.toHexString(\n        java.lang.System.identityHashCode(this)));\n"
    ;
    text_12._M_len = 0x1dd;
    io::Printer::Print<>(pPVar17,text_12);
    bVar11 = EnumDescriptor::is_closed(pEVar10->descriptor_);
    if (bVar11) {
      pcVar16 = "  result.append(\" number=\").append(getNumber());\n";
      sVar21 = 0x31;
    }
    else {
      pcVar16 = 
      "  if (this != UNRECOGNIZED) {\n    result.append(\" number=\").append(getNumber());\n  }\n";
      sVar21 = 0x55;
    }
    text_13._M_str = pcVar16;
    text_13._M_len = sVar21;
    io::Printer::Print<>(pPVar17,text_13);
    text_14._M_str =
         "  return result.append(\" name=\")\n      .append(name()).append(\'>\').toString();\n}\n\n"
    ;
    text_14._M_len = 0x52;
    io::Printer::Print<>(pPVar17,text_14);
  }
  puVar4 = (ushort *)(pEVar10->descriptor_->all_names_).payload_;
  local_218._M_dataplus._M_p = (pointer)(ulong)*puVar4;
  local_218._M_string_length = (long)puVar4 + ~(ulong)local_218._M_dataplus._M_p;
  text_15._M_str = "private final int value;\n\nprivate $classname$(int value) {\n";
  text_15._M_len = 0x3b;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (pPVar17,text_15,(char (*) [10])0x549f88,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_218);
  text_16._M_str = "  this.value = value;\n}\n";
  text_16._M_len = 0x18;
  io::Printer::Print<>(pPVar17,text_16);
  pcVar16 = (pEVar10->descriptor_->all_names_).payload_;
  local_218._M_dataplus._M_p = (pointer)(ulong)*(ushort *)(pcVar16 + 2);
  local_218._M_string_length = (size_type)(pcVar16 + ~(ulong)local_218._M_dataplus._M_p);
  text_17._M_str = "\n// @@protoc_insertion_point(enum_scope:$full_name$)\n";
  text_17._M_len = 0x35;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (pPVar17,text_17,(char (*) [10])0x688d99,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_218);
  io::Printer::Outdent(pPVar17);
  text_18._M_str = "}\n\n";
  text_18._M_len = 3;
  io::Printer::Print<>(pPVar17,text_18);
  return;
}

Assistant:

void EnumLiteGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, descriptor_, context_->options());
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_, immutable_api_);


  printer->Print(
      "$deprecation$public enum $classname$\n"
      "    implements com.google.protobuf.Internal.EnumLite {\n",
      "classname", descriptor_->name(), "deprecation",
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "");
  printer->Annotate("classname", descriptor_);
  printer->Indent();

  for (const EnumValueDescriptor* value : canonical_values_) {
    absl::flat_hash_map<absl::string_view, std::string> vars;
    vars["name"] = std::string(value->name());
    vars["number"] = absl::StrCat(value->number());
    WriteEnumValueDocComment(printer, value, context_->options());
    if (value->options().deprecated()) {
      printer->Print("@java.lang.Deprecated\n");
    }
    printer->Print(vars, "$name$($number$),\n");
    printer->Annotate("name", value);
  }

  if (!descriptor_->is_closed()) {
    printer->Print("${$UNRECOGNIZED$}$(-1),\n", "{", "", "}", "");
    printer->Annotate("{", "}", descriptor_);
  }

  printer->Print(
      ";\n"
      "\n");

  // -----------------------------------------------------------------

  for (const Alias& alias : aliases_) {
    absl::flat_hash_map<absl::string_view, std::string> vars;
    vars["classname"] = std::string(descriptor_->name());
    vars["name"] = std::string(alias.value->name());
    vars["canonical_name"] = std::string(alias.canonical_value->name());
    WriteEnumValueDocComment(printer, alias.value, context_->options());
    printer->Print(
        vars, "public static final $classname$ $name$ = $canonical_name$;\n");
    printer->Annotate("name", alias.value);
  }

  for (int i = 0; i < descriptor_->value_count(); i++) {
    absl::flat_hash_map<absl::string_view, std::string> vars;
    vars["name"] = std::string(descriptor_->value(i)->name());
    vars["number"] = absl::StrCat(descriptor_->value(i)->number());
    vars["{"] = "";
    vars["}"] = "";
    vars["deprecation"] = descriptor_->value(i)->options().deprecated()
                              ? "@java.lang.Deprecated "
                              : "";
    WriteEnumValueDocComment(printer, descriptor_->value(i),
                             context_->options());
    printer->Print(vars,
                   "$deprecation$public static final int ${$$name$_VALUE$}$ = "
                   "$number$;\n");
    printer->Annotate("{", "}", descriptor_->value(i));
  }
  printer->Print("\n");

  // -----------------------------------------------------------------

  printer->Print(
      "\n"
      "@java.lang.Override\n"
      "public final int getNumber() {\n");
  if (!descriptor_->is_closed()) {
    printer->Print(
        "  if (this == UNRECOGNIZED) {\n"
        "    throw new java.lang.IllegalArgumentException(\n"
        "        \"Can't get the number of an unknown enum value.\");\n"
        "  }\n");
  }
  printer->Print(
      "  return value;\n"
      "}\n"
      "\n");
  if (context_->options().opensource_runtime) {
    printer->Print(
        "/**\n"
        " * @param value The number of the enum to look for.\n"
        " * @return The enum associated with the given number.\n"
        " * @deprecated Use {@link #forNumber(int)} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public static $classname$ valueOf(int value) {\n"
        "  return forNumber(value);\n"
        "}\n"
        "\n",
        "classname", descriptor_->name());
  }

  if (!context_->options().opensource_runtime) {
    printer->Print("@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n");
  }
  printer->Print(
      "public static $classname$ forNumber(int value) {\n"
      "  switch (value) {\n",
      "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (const EnumValueDescriptor* value : canonical_values_) {
    printer->Print("case $number$: return $name$;\n", "name", value->name(),
                   "number", absl::StrCat(value->number()));
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "    default: return null;\n"
      "  }\n"
      "}\n"
      "\n"
      "public static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n"
      "    internalGetValueMap() {\n"
      "  return internalValueMap;\n"
      "}\n"
      "private static final com.google.protobuf.Internal.EnumLiteMap<\n"
      "    $classname$> internalValueMap =\n"
      "      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n"
      "        @java.lang.Override\n"
      "        public $classname$ findValueByNumber(int number) {\n"
      "          return $classname$.forNumber(number);\n"
      "        }\n"
      "      };\n"
      "\n"
      "public static com.google.protobuf.Internal.EnumVerifier \n"
      "    internalGetVerifier() {\n"
      "  return $classname$Verifier.INSTANCE;\n"
      "}\n"
      "\n"
      "private static final class $classname$Verifier implements \n"
      "     com.google.protobuf.Internal.EnumVerifier { \n"
      "        static final com.google.protobuf.Internal.EnumVerifier\n"
      "            INSTANCE = new $classname$Verifier();\n"
      "        @java.lang.Override\n"
      "        public boolean isInRange(int number) {\n"
      "          return $classname$.forNumber(number) != null;\n"
      "        }\n"
      "      };\n"
      "\n",
      "classname", descriptor_->name());
  if (!context_->options().opensource_runtime) {
    printer->Print(
        "/**\n"
        " * Override of toString that prints the number and name.\n"
        " * This is primarily intended as a developer aid.\n"
        " *\n"
        " * <p>NOTE: This implementation is liable to change in the future,\n"
        " * and should not be relied on in code.\n"
        " */\n"
        "@java.lang.Override\n"
        "public java.lang.String toString() {\n"
        "  StringBuilder result = new StringBuilder(\"<\");\n"
        "  result.append(getClass().getName()).append('@')\n"
        "      .append(java.lang.Integer.toHexString(\n"
        "        java.lang.System.identityHashCode(this)));\n");
    if (!descriptor_->is_closed()) {
      printer->Print(
          "  if (this != UNRECOGNIZED) {\n"
          "    result.append(\" number=\").append(getNumber());\n"
          "  }\n");
    } else {
      printer->Print("  result.append(\" number=\").append(getNumber());\n");
    }
    printer->Print(
        "  return result.append(\" name=\")\n"
        "      .append(name()).append('>').toString();\n"
        "}\n"
        "\n");
  }

  printer->Print(
      "private final int value;\n\n"
      "private $classname$(int value) {\n",
      "classname", descriptor_->name());
  printer->Print(
      "  this.value = value;\n"
      "}\n");

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(enum_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}